

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O1

bool __thiscall
ASDCP::MXF::SimpleArray<ASDCP::MXF::RIP::PartitionPair>::Archive
          (SimpleArray<ASDCP::MXF::RIP::PartitionPair> *this,MemIOWriter *Writer)

{
  char cVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (this->
           super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
           ).
           super__List_base<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 == (_List_node_base *)
                &this->
                 super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
     ) {
    cVar1 = '\x01';
  }
  else {
    do {
      cVar1 = (*(code *)p_Var2[1]._M_next[2]._M_next)(p_Var2 + 1,Writer);
      if (cVar1 == '\0') {
        return (bool)'\0';
      }
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_List_node_base *)
                       &this->
                        super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
            );
  }
  return (bool)cVar1;
}

Assistant:

bool Archive(Kumu::MemIOWriter* Writer) const {
	    bool result = true;
	    typename std::list<T>::const_iterator l_i = this->begin();

	    for ( ; l_i != this->end() && result; l_i++ )
	      result = (*l_i).Archive(Writer);

	    return result;
	  }